

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

void QHttpHeadersPrivate::removeAll(Self *d,HeaderName *name)

{
  QHttpHeadersPrivate *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  const_iterator cVar5;
  iterator iVar6;
  iterator iVar7;
  Header *pHVar8;
  QList<Header> *this;
  long in_FS_OFFSET;
  bool __ret;
  anon_class_16_2_9763bfdf local_50;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (d->d).ptr;
  cVar5.i = (pQVar1->headers).d.ptr;
  cVar5 = std::find_if<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                    (cVar5,cVar5.i + (pQVar1->headers).d.size,
                     (anon_class_8_1_898f2789_for__M_pred)name);
  pQVar1 = (d->d).ptr;
  pHVar8 = (pQVar1->headers).d.ptr;
  if (cVar5.i != pHVar8 + (pQVar1->headers).d.size) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(d);
    this = &((d->d).ptr)->headers;
    iVar6 = QList<Header>::begin(this);
    iVar7 = QList<Header>::end(&((d->d).ptr)->headers);
    iVar6 = std::
            __find_if<QList<Header>::iterator,__gnu_cxx::__ops::_Iter_pred<headerNameMatches(HeaderName_const&)::__0>>
                      (((long)cVar5.i - (long)pHVar8) + iVar6.i,iVar7,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qhttpheaders_cpp:785:12)>
                        )name);
    if ((iVar6.i != iVar7.i) && (pHVar8 = iVar6.i + 1, pHVar8 != iVar7.i)) {
      do {
        local_39 = '\x01';
        local_50.__ret = (bool *)&local_39;
        local_50.__lhs = (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr
          [(long)(char)*(__index_type *)
                        ((long)&(name->data).
                                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                        + 0x18) + 1]._M_data)(&local_50,&name->data);
        if (local_39 == '\0') {
          local_50.__ret = (bool *)iVar6.i;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
            ::_S_vtable._M_arr
            [(long)(char)*(__index_type *)
                          ((long)&(pHVar8->name).data.
                                  super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .
                                  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                          + 0x18) + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)&local_50,
                     (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar8);
          pDVar2 = ((iVar6.i)->value).d.d;
          ((iVar6.i)->value).d.d = (pHVar8->value).d.d;
          (pHVar8->value).d.d = pDVar2;
          pcVar3 = ((iVar6.i)->value).d.ptr;
          ((iVar6.i)->value).d.ptr = (pHVar8->value).d.ptr;
          (pHVar8->value).d.ptr = pcVar3;
          qVar4 = ((iVar6.i)->value).d.size;
          ((iVar6.i)->value).d.size = (pHVar8->value).d.size;
          (pHVar8->value).d.size = qVar4;
          iVar6.i = iVar6.i + 1;
        }
        pHVar8 = pHVar8 + 1;
      } while (pHVar8 != iVar7.i);
    }
    iVar7 = QList<Header>::end(&((d->d).ptr)->headers);
    QList<Header>::erase(this,(const_iterator)iVar6.i,(const_iterator)iVar7.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeadersPrivate::removeAll(Self &d, const HeaderName &name)
{
    const auto it = std::find_if(d->headers.cbegin(), d->headers.cend(), headerNameMatches(name));

    if (it != d->headers.cend()) {
        // Found something to remove, calculate offset so we can proceed from the match-location
        const auto matchOffset = it - d->headers.cbegin();
        d.detach();
        // Rearrange all matches to the end and erase them
        d->headers.erase(std::remove_if(d->headers.begin() + matchOffset, d->headers.end(),
                                        headerNameMatches(name)),
                         d->headers.end());
    }
}